

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

void __thiscall RunContext::Run(RunContext *this)

{
  BaseNode *pBVar1;
  pointer pCVar2;
  pointer ppBVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  Connection *c;
  pointer this_00;
  pointer ppBVar8;
  pointer ppBVar9;
  pointer ppBVar10;
  
  ppBVar9 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar10 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar8 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar9) {
    (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar9;
    ppBVar10 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppBVar8 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  for (; ppBVar10 != ppBVar8; ppBVar10 = ppBVar10 + 1) {
    pBVar1 = *ppBVar10;
    this_00 = (pBVar1->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (pBVar1->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pCVar2) {
      do {
        bVar5 = 5;
        if ((BaseNode *)this_00->output_node == pBVar1) {
          bVar4 = Connection::Prepare(this_00,this);
          bVar5 = !bVar4;
        }
        if ((bVar5 != 5) && (bVar5 != 0)) goto LAB_00155021;
        this_00 = this_00 + 1;
      } while (this_00 != pCVar2);
      bVar5 = 0;
LAB_00155021:
      if ((bVar5 & 3) != 0) {
        if (ppBVar10 != ppBVar8) {
          return;
        }
        break;
      }
    }
  }
  ppBVar10 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppBVar8 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar4) {
    iVar7 = (*(*nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_vptr_BaseNode[4])
                      (*nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
                        super__Vector_impl_data._M_start,this);
    cVar6 = (char)iVar7;
    while (cVar6 != '\0') {
      ppBVar8 = ppBVar8 + 1;
      bVar4 = ppBVar8 == ppBVar10;
      if (bVar4) goto LAB_00155082;
      iVar7 = (*(*ppBVar8)->_vptr_BaseNode[4])(*ppBVar8,this);
      cVar6 = (char)iVar7;
    }
    if (!bVar4) {
      return;
    }
  }
LAB_00155082:
  ppBVar3 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar9 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar9 != ppBVar3; ppBVar9 = ppBVar9 + 1
      ) {
    (*(*ppBVar9)->_vptr_Block[2])();
  }
  return;
}

Assistant:

void RunContext::Run()
{
    pipeline.Clear();

    for (auto node : nodes)
    {
        for (auto& c : node->connections)
        {
            if (c.output_node != node)
                continue;
            if (!c.Prepare(*this))
            {
                return;
            }
        }
    }

    for (auto node : nodes)
    {
        if (!node->Prepare(*this))
        {
            return;
        }
    }

    pipeline.Launch();
}